

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbersfromtextfiles.h
# Opt level: O0

uint32_t * read_integer_file(char *filename,size_t *howmany)

{
  char *__ptr;
  ulong *in_RSI;
  bool bVar1;
  uint32_t currentint;
  size_t i;
  size_t pos;
  uint32_t *answer;
  size_t i1;
  size_t howmanyints;
  char *buffer;
  uint32_t local_4c;
  char *in_stack_ffffffffffffffb8;
  ulong uVar2;
  ulong uVar3;
  ulong local_40;
  ulong local_30;
  ulong local_28;
  uint32_t *local_8;
  
  __ptr = read_file(in_stack_ffffffffffffffb8);
  if (__ptr == (char *)0x0) {
    local_8 = (uint32_t *)0x0;
  }
  else {
    local_28 = 1;
    for (local_30 = 0; __ptr[local_30] != '\0'; local_30 = local_30 + 1) {
      if (__ptr[local_30] == ',') {
        local_28 = local_28 + 1;
      }
    }
    local_8 = (uint32_t *)malloc(local_28 << 2);
    if (local_8 == (uint32_t *)0x0) {
      local_8 = (uint32_t *)0x0;
    }
    else {
      local_40 = 0;
      uVar2 = 0;
      while( true ) {
        bVar1 = false;
        if (uVar2 < local_30) {
          bVar1 = __ptr[uVar2] != '\0';
        }
        if (!bVar1) break;
        while( true ) {
          bVar1 = true;
          if ('/' < __ptr[uVar2]) {
            bVar1 = '9' < __ptr[uVar2];
          }
          if (!bVar1) break;
          uVar2 = uVar2 + 1;
          if (__ptr[uVar2] == '\0') goto LAB_00101d8e;
        }
        local_4c = (int)__ptr[uVar2] - 0x30;
        while( true ) {
          uVar3 = uVar2 + 1;
          bVar1 = false;
          if ('/' < __ptr[uVar3]) {
            bVar1 = __ptr[uVar3] < ':';
          }
          if (!bVar1) break;
          local_4c = local_4c * 10 + __ptr[uVar3] + -0x30;
          uVar2 = uVar3;
        }
        local_8[local_40] = local_4c;
        uVar2 = uVar2 + 2;
        local_40 = local_40 + 1;
      }
LAB_00101d8e:
      if (local_40 != local_28) {
        printf("unexpected number of integers! %d %d \n",local_40 & 0xffffffff,local_28 & 0xffffffff
              );
      }
      *in_RSI = local_40;
      free(__ptr);
    }
  }
  return local_8;
}

Assistant:

static uint32_t *read_integer_file(const char *filename, size_t *howmany) {
    char *buffer = read_file(filename);
    if (buffer == NULL) return NULL;

    size_t howmanyints = 1;
    size_t i1 = 0;
    for (; buffer[i1] != '\0'; i1++) {
        if (buffer[i1] == ',') ++howmanyints;
    }

    uint32_t *answer = (uint32_t *)malloc(howmanyints * sizeof(uint32_t));
    if (answer == NULL) return NULL;
    size_t pos = 0;
    for (size_t i = 0; (i < i1) && (buffer[i] != '\0'); i++) {
        uint32_t currentint;
        while ((buffer[i] < '0') || (buffer[i] > '9')) {
            i++;
            if (buffer[i] == '\0') goto END;
        }
        currentint = (uint32_t)(buffer[i] - '0');
        i++;
        for (; (buffer[i] >= '0') && (buffer[i] <= '9'); i++)
            currentint = currentint * 10 + (uint32_t)(buffer[i] - '0');
        answer[pos++] = currentint;
    }
END:
    if (pos != howmanyints) {
        printf("unexpected number of integers! %d %d \n", (int)pos,
               (int)howmanyints);
    }
    *howmany = pos;
    free(buffer);
    return answer;
}